

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void rnn_freedb(rnndb *db)

{
  rnnenum *__ptr;
  rnnbitset *__ptr_00;
  rnndomain *__ptr_01;
  rnnspectype *__ptr_02;
  rnngroup *__ptr_03;
  rnnauthor **__ptr_04;
  rnnauthor *__ptr_05;
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < db->enumsnum; lVar2 = lVar2 + 1) {
    __ptr = db->enums[lVar2];
    cleanupvarinfo(&__ptr->varinfo);
    for (lVar1 = 0; lVar1 < __ptr->valsnum; lVar1 = lVar1 + 1) {
      freevalue(__ptr->vals[lVar1]);
    }
    free(__ptr->vals);
    free(__ptr->fullname);
    free(__ptr->name);
    free(__ptr);
  }
  free(db->enums);
  for (lVar2 = 0; lVar2 < db->bitsetsnum; lVar2 = lVar2 + 1) {
    __ptr_00 = db->bitsets[lVar2];
    cleanupvarinfo(&__ptr_00->varinfo);
    for (lVar1 = 0; lVar1 < __ptr_00->bitfieldsnum; lVar1 = lVar1 + 1) {
      freebitfield(__ptr_00->bitfields[lVar1]);
    }
    free(__ptr_00->bitfields);
    free(__ptr_00->fullname);
    free(__ptr_00->name);
    free(__ptr_00);
  }
  free(db->bitsets);
  for (lVar2 = 0; lVar2 < db->domainsnum; lVar2 = lVar2 + 1) {
    __ptr_01 = db->domains[lVar2];
    cleanupvarinfo(&__ptr_01->varinfo);
    for (lVar1 = 0; lVar1 < __ptr_01->subelemsnum; lVar1 = lVar1 + 1) {
      freedelem(__ptr_01->subelems[lVar1]);
    }
    free(__ptr_01->subelems);
    free(__ptr_01->fullname);
    free(__ptr_01->name);
    free(__ptr_01);
  }
  free(db->domains);
  for (lVar2 = 0; lVar2 < db->spectypesnum; lVar2 = lVar2 + 1) {
    __ptr_02 = db->spectypes[lVar2];
    cleanuptypeinfo(&__ptr_02->typeinfo);
    free(__ptr_02->name);
    free(__ptr_02);
  }
  free(db->spectypes);
  for (lVar2 = 0; lVar2 < db->groupsnum; lVar2 = lVar2 + 1) {
    __ptr_03 = db->groups[lVar2];
    free(__ptr_03->name);
    for (lVar1 = 0; lVar1 < __ptr_03->subelemsnum; lVar1 = lVar1 + 1) {
      freedelem(__ptr_03->subelems[lVar1]);
    }
    free(__ptr_03->subelems);
    free(__ptr_03);
  }
  free(db->groups);
  for (lVar2 = 0; __ptr_04 = (db->copyright).authors, lVar2 < (db->copyright).authorsnum;
      lVar2 = lVar2 + 1) {
    __ptr_05 = __ptr_04[lVar2];
    for (lVar1 = 0; lVar1 < __ptr_05->nicknamesnum; lVar1 = lVar1 + 1) {
      free(__ptr_05->nicknames[lVar1]);
    }
    free(__ptr_05->nicknames);
    free(__ptr_05->contributions);
    free(__ptr_05->email);
    free(__ptr_05->license);
    free(__ptr_05->name);
    free(__ptr_05);
  }
  free(__ptr_04);
  free((db->copyright).license);
  for (lVar2 = 0; lVar2 < db->filesnum; lVar2 = lVar2 + 1) {
    free(db->files[lVar2]);
  }
  free(db->files);
  free(db);
  return;
}

Assistant:

void rnn_freedb (struct rnndb *db) {
	int i;

	for (i = 0; i < db->enumsnum; i++)
		freeenum(db->enums[i]);
	free(db->enums);

	for (i = 0; i < db->bitsetsnum; i++)
		freebitset(db->bitsets[i]);
	free(db->bitsets);

	for (i = 0; i < db->domainsnum; i++)
		freedomain(db->domains[i]);
	free(db->domains);

	for (i = 0; i < db->spectypesnum; i++)
		freespectype(db->spectypes[i]);
	free(db->spectypes);

	for (i = 0; i < db->groupsnum; i++)
		freegroup(db->groups[i]);
	free(db->groups);

	cleanupcopyright(&db->copyright);

	for (i = 0; i < db->filesnum; i++)
		free(db->files[i]);
	free(db->files);

	free(db);
}